

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

bool __thiscall
OpenMesh::PolyConnectivity::is_boundary(PolyConnectivity *this,FaceHandle _fh,bool _check_vertex)

{
  bool bVar1;
  value_type _eh;
  value_type _vh;
  undefined1 local_40 [8];
  ConstFaceEdgeIter cfeit;
  
  cfe_iter((ConstFaceEdgeIter *)local_40,this,_fh);
  while ((cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
         (((int)cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
           cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
          (cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
           idx_ == 0))))) {
    _eh = Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
          ::operator*((ConstFaceEdgeIter *)local_40);
    bVar1 = is_boundary(this,(EdgeHandle)_eh.super_BaseHandle.idx_);
    if (bVar1) {
      return true;
    }
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
    ::operator++((ConstFaceEdgeIter *)local_40);
  }
  if (_check_vertex) {
    cfv_iter((ConstFaceVertexIter *)local_40,this,_fh);
    while ((cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
           (((int)cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
             cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
            (cfeit.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
             idx_ == 0))))) {
      _vh = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
            ::operator*((ConstFaceVertexIter *)local_40);
      bVar1 = is_boundary(this,(VertexHandle)_vh.super_BaseHandle.idx_);
      if (bVar1) {
        return true;
      }
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
      ::operator++((ConstFaceVertexIter *)local_40);
    }
  }
  return false;
}

Assistant:

bool PolyConnectivity::is_boundary(FaceHandle _fh, bool _check_vertex) const
{
  for (ConstFaceEdgeIter cfeit = cfe_iter( _fh ); cfeit.is_valid(); ++cfeit)
      if (is_boundary( *cfeit ) )
        return true;

  if (_check_vertex)
  {
      for (ConstFaceVertexIter cfvit = cfv_iter( _fh ); cfvit.is_valid(); ++cfvit)
        if (is_boundary( *cfvit ) )
            return true;
  }
  return false;
}